

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O2

int run_test_loop_instant_close(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar1 == 0) {
    iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uStack_10 = 0x49;
    }
    else {
      pcVar3 = 
      "0 == uv_queue_work(&loop, &req, loop_instant_close_work_cb, loop_instant_close_after_work_cb)"
      ;
      uStack_10 = 0x48;
    }
  }
  else {
    pcVar3 = "0 == uv_loop_init(&loop)";
    uStack_10 = 0x44;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(loop_instant_close) {
  static uv_loop_t loop;
  static uv_work_t req;
  ASSERT(0 == uv_loop_init(&loop));
  ASSERT(0 == uv_queue_work(&loop,
                            &req,
                            loop_instant_close_work_cb,
                            loop_instant_close_after_work_cb));
  MAKE_VALGRIND_HAPPY();
  return 0;
}